

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::MessageSetItemByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  Reflection *field_00;
  size_t sVar2;
  MessageFactory *factory;
  Message *pMVar3;
  undefined4 extraout_var;
  Message *in_RSI;
  Reflection *in_RDI;
  size_t message_size;
  Message *sub_message;
  size_t our_size;
  Reflection *message_reflection;
  Message *in_stack_ffffffffffffffd0;
  long lVar4;
  
  field_00 = Message::GetReflection(in_stack_ffffffffffffffd0);
  lVar4 = 4;
  FieldDescriptor::number((FieldDescriptor *)in_RDI);
  sVar2 = io::CodedOutputStream::VarintSize32(0);
  factory = (MessageFactory *)(sVar2 + lVar4);
  pMVar3 = Reflection::GetMessage(in_RDI,in_RSI,(FieldDescriptor *)field_00,factory);
  iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[0xb])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  sVar2 = io::CodedOutputStream::VarintSize32(0);
  return (long)&factory->_vptr_MessageFactory + lVar4 + sVar2;
}

Assistant:

size_t WireFormat::MessageSetItemByteSize(const FieldDescriptor* field,
                                          const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  size_t message_size = sub_message.ByteSizeLong();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}